

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManIsVerilogPrim(char *pName)

{
  long lVar1;
  int iVar2;
  long lVar3;
  Prs_VerPrim_t *pPVar4;
  
  iVar2 = strcmp(pName,"buf");
  if (iVar2 == 0) {
    pPVar4 = s_VerilogPrims;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x90) {
        return 0;
      }
      iVar2 = strcmp(pName,*(char **)((long)&s_VerilogPrims[1].pName + lVar3));
      lVar1 = lVar3 + 0x10;
    } while (iVar2 != 0);
    pPVar4 = (Prs_VerPrim_t *)((long)&s_VerilogPrims[1].Type + lVar3);
  }
  return pPVar4->Type;
}

Assistant:

static inline int Prs_ManIsVerilogPrim( char * pName )
{
    int i;
    for ( i = 0; s_VerilogPrims[i].pName; i++ )
        if ( !strcmp(pName, s_VerilogPrims[i].pName) )
            return s_VerilogPrims[i].Type;
    return 0;
}